

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::GenericSwap(MessageLite *m1,MessageLite *m2)

{
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
  uVar1;
  MessageLite *__p;
  pointer pMVar2;
  type pMVar3;
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
  local_20;
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_> tmp
  ;
  MessageLite *m2_local;
  MessageLite *m1_local;
  
  tmp._M_t.
  super___uniq_ptr_impl<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::MessageLite_*,_std::default_delete<google::protobuf::MessageLite>_>
  .super__Head_base<0UL,_google::protobuf::MessageLite_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>,_true,_true>
          )m2;
  __p = MessageLite::New(m1);
  std::unique_ptr<google::protobuf::MessageLite,std::default_delete<google::protobuf::MessageLite>>
  ::unique_ptr<std::default_delete<google::protobuf::MessageLite>,void>
            ((unique_ptr<google::protobuf::MessageLite,std::default_delete<google::protobuf::MessageLite>>
              *)&local_20,__p);
  pMVar2 = std::
           unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
           ::operator->(&local_20);
  (*pMVar2->_vptr_MessageLite[7])(pMVar2,m1);
  (*m1->_vptr_MessageLite[4])();
  (*m1->_vptr_MessageLite[7])
            (m1,tmp._M_t.
                super___uniq_ptr_impl<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::MessageLite_*,_std::default_delete<google::protobuf::MessageLite>_>
                .super__Head_base<0UL,_google::protobuf::MessageLite_*,_false>._M_head_impl);
  (**(code **)(*(long *)tmp._M_t.
                        super___uniq_ptr_impl<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::MessageLite_*,_std::default_delete<google::protobuf::MessageLite>_>
                        .super__Head_base<0UL,_google::protobuf::MessageLite_*,_false>._M_head_impl
              + 0x20))();
  uVar1 = tmp;
  pMVar3 = std::
           unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
           ::operator*(&local_20);
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::MessageLite_*,_std::default_delete<google::protobuf::MessageLite>_>
                        .super__Head_base<0UL,_google::protobuf::MessageLite_*,_false>._M_head_impl
              + 0x38))
            (uVar1._M_t.
             super___uniq_ptr_impl<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::MessageLite_*,_std::default_delete<google::protobuf::MessageLite>_>
             .super__Head_base<0UL,_google::protobuf::MessageLite_*,_false>._M_head_impl,pMVar3);
  std::
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>::
  ~unique_ptr(&local_20);
  return;
}

Assistant:

void GenericSwap(MessageLite* m1, MessageLite* m2) {
  std::unique_ptr<MessageLite> tmp(m1->New());
  tmp->CheckTypeAndMergeFrom(*m1);
  m1->Clear();
  m1->CheckTypeAndMergeFrom(*m2);
  m2->Clear();
  m2->CheckTypeAndMergeFrom(*tmp);
}